

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGlyphs.cpp
# Opt level: O3

void __thiscall chrono::ChGlyphs::ArchiveOUT(ChGlyphs *this,ChArchiveOut *marchive)

{
  eCh_GlyphType_mapper mmapper;
  eCh_GlyphType_mapper local_80;
  ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType> local_60;
  char *local_40;
  ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType> *local_38;
  undefined1 local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChGlyphs>(marchive);
  ChVisualShape::ArchiveOUT(&this->super_ChVisualShape,marchive);
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.value_ptr =
       (eCh_GlyphType *)&this->points;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9eb70a;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
                       *)&local_80);
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.value_ptr =
       (eCh_GlyphType *)&this->colors;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9da8f6;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveOut::out<chrono::ChColor>
            (marchive,(ChNameValue<std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>_>
                       *)&local_80);
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.value_ptr =
       (eCh_GlyphType *)&this->vectors;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9dcf2d;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
                       *)&local_80);
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.value_ptr =
       (eCh_GlyphType *)&this->rotations;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9dcf35;
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveOut::out<chrono::ChQuaternion<double>>
            (marchive,(ChNameValue<std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>_>
                       *)&local_80);
  eCh_GlyphType_mapper::eCh_GlyphType_mapper(&local_80);
  eCh_GlyphType_mapper::operator()(&local_60,&local_80,&this->draw_mode);
  local_40 = "draw_mode";
  local_30 = 0;
  local_38 = &local_60;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xb])(marchive);
  local_60.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b413b8
  ;
  if (local_60.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_60.value_ptr = (eCh_GlyphType *)&this->size;
  local_60.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x954449;
  local_60.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  local_60.value_ptr = (eCh_GlyphType *)&this->zbuffer_hide;
  local_60.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9dcf49;
  local_60.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive);
  local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b413b8;
  if (local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super_ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChGlyphs::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChGlyphs>();
    // serialize parent class
    ChVisualShape::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(points);
    marchive << CHNVP(colors);
    marchive << CHNVP(vectors);
    marchive << CHNVP(rotations);
    eCh_GlyphType_mapper mmapper;
    marchive << CHNVP(mmapper(draw_mode), "draw_mode");
    marchive << CHNVP(size);
    marchive << CHNVP(zbuffer_hide);
}